

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O2

void coda_get_uint64set(char *str,
                       set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                       *result)

{
  char *pcVar1;
  uint64_t temp;
  
  while (str != (char *)0x0) {
    __isoc99_sscanf(str,"%lu",&temp);
    std::
    _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
    ::_M_insert_unique<unsigned_long_const&>
              ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                *)result,&temp);
    pcVar1 = strchr(str,0x2c);
    str = pcVar1 + 1;
    if (pcVar1 == (char *)0x0) {
      str = (char *)0x0;
    }
  }
  return;
}

Assistant:

void coda_get_uint64set(const char* str, std::set<uint64_t>& result)
{
	const char* i = str;
	while (i)
	{
		uint64_t temp;
		sscanf(i, "%" PRIu64, &temp);
		result.insert(temp);
		i = strchr(i, ',');
		if (i)
		{
			++i;
		}
	}
}